

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactor_impl.h
# Opt level: O1

void __thiscall iqnet::Reactor<iqnet::Null_lock>::~Reactor(Reactor<iqnet::Null_lock> *this)

{
  ~Reactor(this);
  operator_delete(this,0x70);
  return;
}

Assistant:

~Reactor() {}